

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  undefined1 auVar2 [16];
  Ref<embree::Geometry> *pRVar3;
  Geometry *pGVar4;
  long lVar5;
  RTCIntersectArguments *pRVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  int iVar29;
  AABBNodeMB4D *node1;
  ulong uVar30;
  long lVar31;
  uint uVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  bool bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  float fVar77;
  undefined4 uVar78;
  undefined1 auVar79 [32];
  float fVar80;
  float fVar83;
  float fVar84;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  uint uVar96;
  uint uVar97;
  uint uVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar95 [64];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 in_ZMM29 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_1544;
  Scene *local_1540;
  long local_1538;
  Geometry *local_1530;
  ulong local_1528;
  long local_1520;
  long local_1518;
  ulong *local_1510;
  long local_1508;
  undefined4 local_1500;
  undefined4 local_14fc;
  undefined4 local_14f8;
  undefined4 local_14f4;
  undefined4 local_14f0;
  undefined4 local_14ec;
  uint local_14e8;
  uint local_14e4;
  uint local_14e0;
  RTCFilterFunctionNArguments local_14d0;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  byte local_12df;
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined4 uStack_12a4;
  undefined1 local_12a0 [32];
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  ulong local_1200;
  ulong local_11f8 [569];
  
  local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200 != 8) {
    fVar80 = ray->tfar;
    vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
    auVar66 = vucomiss_avx512f(ZEXT416((uint)fVar80));
    auVar108 = ZEXT1664(auVar66);
    if (local_1200 < 9) {
      local_1510 = local_11f8;
      aVar1 = (ray->dir).field_0.field_1;
      auVar42 = vmaxss_avx512f(auVar66,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar43._8_4_ = 0x7fffffff;
      auVar43._0_8_ = 0x7fffffff7fffffff;
      auVar43._12_4_ = 0x7fffffff;
      auVar43 = vandps_avx512vl((undefined1  [16])aVar1,auVar43);
      auVar60._8_4_ = 0x219392ef;
      auVar60._0_8_ = 0x219392ef219392ef;
      auVar60._12_4_ = 0x219392ef;
      uVar37 = vcmpps_avx512vl(auVar43,auVar60,1);
      bVar41 = (bool)((byte)uVar37 & 1);
      auVar57._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * (int)aVar1.x;
      bVar41 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar57._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * (int)aVar1.y;
      bVar41 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar57._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * (int)aVar1.z;
      bVar41 = (bool)((byte)(uVar37 >> 3) & 1);
      auVar57._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * aVar1.field_3.a;
      auVar43 = vrcp14ps_avx512vl(auVar57);
      auVar44._8_4_ = 0x3f800000;
      auVar44._0_8_ = 0x3f8000003f800000;
      auVar44._12_4_ = 0x3f800000;
      auVar44 = vfnmadd213ps_avx512vl(auVar57,auVar43,auVar44);
      vfmadd132ps_fma(auVar44,auVar43,auVar43);
      auVar44 = vucomiss_avx512f(auVar66);
      auVar69 = vbroadcastss_avx512vl(auVar44);
      auVar109 = ZEXT3264(auVar69);
      auVar43 = vmovshdup_avx(auVar44);
      auVar69 = vbroadcastsd_avx512vl(auVar43);
      auVar110 = ZEXT3264(auVar69);
      vshufpd_avx(auVar44,auVar44,1);
      auVar71._8_4_ = 2;
      auVar71._0_8_ = 0x200000002;
      auVar71._12_4_ = 2;
      auVar71._16_4_ = 2;
      auVar71._20_4_ = 2;
      auVar71._24_4_ = 2;
      auVar71._28_4_ = 2;
      local_13c0 = vpermps_avx2(auVar71,ZEXT1632(auVar44));
      auVar94 = ZEXT3264(local_13c0);
      fVar77 = auVar44._0_4_ * (ray->org).field_0.m128[0];
      auVar69._8_4_ = 1;
      auVar69._0_8_ = 0x100000001;
      auVar69._12_4_ = 1;
      auVar69._16_4_ = 1;
      auVar69._20_4_ = 1;
      auVar69._24_4_ = 1;
      auVar69._28_4_ = 1;
      auVar70 = ZEXT1632(CONCAT412(auVar44._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar44._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar44._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar77))));
      auVar69 = vpermps_avx2(auVar69,auVar70);
      auVar70 = vpermps_avx2(auVar71,auVar70);
      vucomiss_avx512f(auVar66);
      vucomiss_avx512f(auVar66);
      uVar78 = auVar42._0_4_;
      local_13e0._4_4_ = uVar78;
      local_13e0._0_4_ = uVar78;
      local_13e0._8_4_ = uVar78;
      local_13e0._12_4_ = uVar78;
      local_13e0._16_4_ = uVar78;
      local_13e0._20_4_ = uVar78;
      local_13e0._24_4_ = uVar78;
      local_13e0._28_4_ = uVar78;
      auVar86 = ZEXT3264(local_13e0);
      local_1400._4_4_ = fVar80;
      local_1400._0_4_ = fVar80;
      local_1400._8_4_ = fVar80;
      local_1400._12_4_ = fVar80;
      local_1400._16_4_ = fVar80;
      local_1400._20_4_ = fVar80;
      local_1400._24_4_ = fVar80;
      local_1400._28_4_ = fVar80;
      auVar95 = ZEXT3264(local_1400);
      local_1420._0_8_ = CONCAT44(fVar77,fVar77) ^ 0x8000000080000000;
      local_1420._8_4_ = -fVar77;
      local_1420._12_4_ = -fVar77;
      local_1420._16_4_ = -fVar77;
      local_1420._20_4_ = -fVar77;
      local_1420._24_4_ = -fVar77;
      local_1420._28_4_ = -fVar77;
      auVar88 = ZEXT3264(local_1420);
      local_1440._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
      local_1440._8_4_ = auVar69._8_4_ ^ 0x80000000;
      local_1440._12_4_ = auVar69._12_4_ ^ 0x80000000;
      local_1440._16_4_ = auVar69._16_4_ ^ 0x80000000;
      local_1440._20_4_ = auVar69._20_4_ ^ 0x80000000;
      local_1440._24_4_ = auVar69._24_4_ ^ 0x80000000;
      local_1440._28_4_ = auVar69._28_4_ ^ 0x80000000;
      auVar91 = ZEXT3264(local_1440);
      local_1460._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
      local_1460._8_4_ = auVar70._8_4_ ^ 0x80000000;
      local_1460._12_4_ = auVar70._12_4_ ^ 0x80000000;
      local_1460._16_4_ = auVar70._16_4_ ^ 0x80000000;
      local_1460._20_4_ = auVar70._20_4_ ^ 0x80000000;
      local_1460._24_4_ = auVar70._24_4_ ^ 0x80000000;
      local_1460._28_4_ = auVar70._28_4_ ^ 0x80000000;
      auVar104 = ZEXT3264(local_1460);
      local_1518 = 0;
      local_1520 = 0x40;
      lVar40 = 0;
      lVar39 = 0x40;
LAB_00697b52:
      do {
        uVar37 = local_1510[-1];
        local_1510 = local_1510 + -1;
        while ((uVar37 & 8) == 0) {
          uVar30 = uVar37 & 0xfffffffffffffff0;
          uVar78 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
          auVar75._4_4_ = uVar78;
          auVar75._0_4_ = uVar78;
          auVar75._8_4_ = uVar78;
          auVar75._12_4_ = uVar78;
          auVar75._16_4_ = uVar78;
          auVar75._20_4_ = uVar78;
          auVar75._24_4_ = uVar78;
          auVar75._28_4_ = uVar78;
          auVar66 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x100 + lVar40),auVar75,
                                    *(undefined1 (*) [32])(uVar30 + 0x40 + lVar40));
          auVar69 = vfmadd213ps_avx512vl(ZEXT1632(auVar66),auVar109._0_32_,auVar88._0_32_);
          auVar69 = vmaxps_avx(auVar86._0_32_,auVar69);
          auVar66 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x100 + lVar39),auVar75,
                                    *(undefined1 (*) [32])(uVar30 + 0x40 + lVar39));
          auVar43 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x180),auVar75,
                                    *(undefined1 (*) [32])(uVar30 + 0xc0));
          auVar70 = vfmadd213ps_avx512vl(ZEXT1632(auVar66),auVar110._0_32_,auVar91._0_32_);
          auVar66 = vfmadd213ps_fma(ZEXT1632(auVar43),auVar94._0_32_,auVar104._0_32_);
          auVar70 = vmaxps_avx(auVar70,ZEXT1632(auVar66));
          auVar69 = vmaxps_avx(auVar69,auVar70);
          auVar66 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x120),auVar75,
                                    *(undefined1 (*) [32])(uVar30 + 0x60));
          auVar70 = vfmadd213ps_avx512vl(ZEXT1632(auVar66),auVar109._0_32_,auVar88._0_32_);
          auVar70 = vminps_avx(auVar95._0_32_,auVar70);
          auVar66 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x160),auVar75,
                                    *(undefined1 (*) [32])(uVar30 + 0xa0));
          auVar43 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x1a0),auVar75,
                                    *(undefined1 (*) [32])(uVar30 + 0xe0));
          auVar71 = vfmadd213ps_avx512vl(ZEXT1632(auVar66),auVar110._0_32_,auVar91._0_32_);
          auVar66 = vfmadd213ps_fma(ZEXT1632(auVar43),auVar94._0_32_,auVar104._0_32_);
          auVar71 = vminps_avx(auVar71,ZEXT1632(auVar66));
          auVar70 = vminps_avx(auVar70,auVar71);
          if (((uint)uVar37 & 7) == 6) {
            uVar15 = vcmpps_avx512vl(auVar69,auVar70,2);
            uVar16 = vcmpps_avx512vl(auVar75,*(undefined1 (*) [32])(uVar30 + 0x1c0),0xd);
            uVar17 = vcmpps_avx512vl(auVar75,*(undefined1 (*) [32])(uVar30 + 0x1e0),1);
            uVar32 = (uint)uVar15 & (uint)uVar16 & (uint)uVar17;
          }
          else {
            uVar15 = vcmpps_avx512vl(auVar69,auVar70,2);
            uVar32 = (uint)uVar15;
          }
          if ((byte)uVar32 == 0) {
            if (local_1510 == &local_1200) {
              return;
            }
            goto LAB_00697b52;
          }
          lVar34 = 0;
          for (uVar37 = (ulong)(byte)uVar32; (uVar37 & 1) == 0;
              uVar37 = uVar37 >> 1 | 0x8000000000000000) {
            lVar34 = lVar34 + 1;
          }
          uVar37 = *(ulong *)(uVar30 + lVar34 * 8);
          uVar32 = (uVar32 & 0xff) - 1 & uVar32 & 0xff;
          uVar33 = (ulong)uVar32;
          if (uVar32 != 0) {
            *local_1510 = uVar37;
            lVar34 = 0;
            for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
              lVar34 = lVar34 + 1;
            }
            uVar32 = uVar32 - 1 & uVar32;
            uVar33 = (ulong)uVar32;
            bVar41 = uVar32 == 0;
            while( true ) {
              local_1510 = local_1510 + 1;
              uVar37 = *(ulong *)(uVar30 + lVar34 * 8);
              if (bVar41) break;
              *local_1510 = uVar37;
              lVar34 = 0;
              for (uVar37 = uVar33; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
                lVar34 = lVar34 + 1;
              }
              uVar33 = uVar33 - 1 & uVar33;
              bVar41 = uVar33 == 0;
            }
          }
        }
        local_1508 = (ulong)((uint)uVar37 & 0xf) - 8;
        if (local_1508 != 0) {
          uVar37 = uVar37 & 0xfffffffffffffff0;
          local_1540 = context->scene;
          local_1538 = 0;
          do {
            lVar39 = local_1538 * 0x60;
            pRVar3 = (local_1540->geometries).items;
            pGVar4 = pRVar3[*(uint *)(uVar37 + 0x40 + lVar39)].ptr;
            fVar80 = (pGVar4->time_range).lower;
            fVar80 = pGVar4->fnumTimeSegments *
                     (((ray->dir).field_0.m128[3] - fVar80) / ((pGVar4->time_range).upper - fVar80))
            ;
            auVar66 = vroundss_avx(ZEXT416((uint)fVar80),ZEXT416((uint)fVar80),9);
            auVar66 = vminss_avx(auVar66,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
            auVar45 = vmaxss_avx512f(auVar108._0_16_,auVar66);
            iVar29 = (int)auVar45._0_4_;
            lVar35 = (long)iVar29 * 0x38;
            lVar40 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar35);
            auVar66 = *(undefined1 (*) [16])(lVar40 + (ulong)*(uint *)(uVar37 + lVar39) * 4);
            uVar33 = (ulong)*(uint *)(uVar37 + 0x10 + lVar39);
            auVar43 = *(undefined1 (*) [16])(lVar40 + uVar33 * 4);
            uVar36 = (ulong)*(uint *)(uVar37 + 0x20 + lVar39);
            auVar44 = *(undefined1 (*) [16])(lVar40 + uVar36 * 4);
            uVar38 = (ulong)*(uint *)(uVar37 + 0x30 + lVar39);
            auVar42 = *(undefined1 (*) [16])(lVar40 + uVar38 * 4);
            uVar30 = CONCAT44(0,*(uint *)(uVar37 + 4 + lVar39));
            local_1480._0_8_ = uVar30;
            lVar31 = (long)(iVar29 + 1) * 0x38;
            local_14a0._0_8_ = lVar31;
            lVar40 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar31);
            auVar57 = *(undefined1 (*) [16])(lVar40 + (ulong)*(uint *)(uVar37 + lVar39) * 4);
            auVar60 = *(undefined1 (*) [16])(lVar40 + uVar33 * 4);
            lVar34 = *(long *)&pRVar3[*(uint *)(uVar37 + 0x44 + lVar39)].ptr[2].numPrimitives;
            lVar5 = *(long *)(lVar34 + lVar35);
            auVar49 = *(undefined1 (*) [16])(lVar5 + uVar30 * 4);
            auVar63 = *(undefined1 (*) [16])(lVar40 + uVar36 * 4);
            uVar36 = (ulong)*(uint *)(uVar37 + 0x14 + lVar39);
            auVar51 = *(undefined1 (*) [16])(lVar5 + uVar36 * 4);
            auVar67 = *(undefined1 (*) [16])(lVar40 + uVar38 * 4);
            uVar33 = (ulong)*(uint *)(uVar37 + 0x24 + lVar39);
            auVar54 = *(undefined1 (*) [16])(lVar5 + uVar33 * 4);
            uVar38 = (ulong)*(uint *)(uVar37 + 0x34 + lVar39);
            auVar56 = *(undefined1 (*) [16])(lVar5 + uVar38 * 4);
            lVar40 = *(long *)&pRVar3[*(uint *)(uVar37 + 0x48 + lVar39)].ptr[2].numPrimitives;
            lVar34 = *(long *)(lVar34 + lVar31);
            auVar59 = *(undefined1 (*) [16])(lVar34 + uVar30 * 4);
            lVar5 = *(long *)(lVar40 + lVar35);
            auVar62 = *(undefined1 (*) [16])(lVar34 + uVar36 * 4);
            uVar36 = (ulong)*(uint *)(uVar37 + 8 + lVar39);
            auVar2 = *(undefined1 (*) [16])(lVar5 + uVar36 * 4);
            auVar64 = *(undefined1 (*) [16])(lVar34 + uVar33 * 4);
            uVar33 = (ulong)*(uint *)(uVar37 + 0x18 + lVar39);
            auVar50 = *(undefined1 (*) [16])(lVar5 + uVar33 * 4);
            auVar68 = *(undefined1 (*) [16])(lVar34 + uVar38 * 4);
            uVar30 = (ulong)*(uint *)(uVar37 + 0x28 + lVar39);
            auVar53 = *(undefined1 (*) [16])(lVar5 + uVar30 * 4);
            uVar38 = (ulong)*(uint *)(uVar37 + 0x38 + lVar39);
            auVar55 = *(undefined1 (*) [16])(lVar5 + uVar38 * 4);
            lVar40 = *(long *)(lVar40 + lVar31);
            auVar58 = *(undefined1 (*) [16])(lVar40 + uVar36 * 4);
            lVar34 = *(long *)&pRVar3[*(uint *)(uVar37 + 0x4c + lVar39)].ptr[2].numPrimitives;
            lVar5 = *(long *)(lVar34 + lVar35);
            auVar61 = *(undefined1 (*) [16])(lVar40 + uVar33 * 4);
            uVar33 = (ulong)*(uint *)(uVar37 + 0xc + lVar39);
            auVar47 = *(undefined1 (*) [16])(lVar5 + uVar33 * 4);
            auVar65 = *(undefined1 (*) [16])(lVar40 + uVar30 * 4);
            uVar36 = (ulong)*(uint *)(uVar37 + 0x1c + lVar39);
            auVar52 = *(undefined1 (*) [16])(lVar5 + uVar36 * 4);
            auVar46 = vunpcklps_avx512vl(auVar66,auVar2);
            auVar2 = vunpckhps_avx(auVar66,auVar2);
            auVar48 = vunpcklps_avx(auVar49,auVar47);
            auVar49 = vunpckhps_avx(auVar49,auVar47);
            auVar66 = *(undefined1 (*) [16])(lVar40 + uVar38 * 4);
            uVar30 = (ulong)*(uint *)(uVar37 + 0x2c + lVar39);
            auVar2 = vunpcklps_avx(auVar2,auVar49);
            auVar47 = vunpcklps_avx512vl(auVar46,auVar48);
            auVar48 = vunpckhps_avx512vl(auVar46,auVar48);
            auVar49 = vunpcklps_avx512vl(auVar43,auVar50);
            auVar50 = vunpckhps_avx512vl(auVar43,auVar50);
            auVar46 = vunpcklps_avx512vl(auVar51,auVar52);
            auVar51 = vunpckhps_avx512vl(auVar51,auVar52);
            auVar43 = *(undefined1 (*) [16])(lVar5 + uVar30 * 4);
            uVar38 = (ulong)*(uint *)(uVar37 + 0x3c + lVar39);
            auVar51 = vunpcklps_avx(auVar50,auVar51);
            auVar50 = vunpcklps_avx512vl(auVar49,auVar46);
            auVar49 = vunpckhps_avx(auVar49,auVar46);
            auVar52 = vunpcklps_avx512vl(auVar44,auVar53);
            auVar53 = vunpckhps_avx512vl(auVar44,auVar53);
            auVar46 = vunpcklps_avx512vl(auVar54,auVar43);
            auVar44 = vunpckhps_avx(auVar54,auVar43);
            auVar43 = *(undefined1 (*) [16])(lVar5 + uVar38 * 4);
            lVar40 = *(long *)(lVar34 + lVar31);
            auVar44 = vunpcklps_avx(auVar53,auVar44);
            auVar54 = vunpcklps_avx512vl(auVar52,auVar46);
            auVar53 = vunpckhps_avx512vl(auVar52,auVar46);
            auVar52 = vunpcklps_avx512vl(auVar42,auVar55);
            auVar42 = vunpckhps_avx512vl(auVar42,auVar55);
            auVar55 = vunpcklps_avx512vl(auVar56,auVar43);
            auVar56 = vunpckhps_avx512vl(auVar56,auVar43);
            auVar43 = *(undefined1 (*) [16])(lVar40 + uVar33 * 4);
            auVar42 = vunpcklps_avx(auVar42,auVar56);
            auVar56 = vunpcklps_avx512vl(auVar52,auVar55);
            auVar55 = vunpckhps_avx512vl(auVar52,auVar55);
            auVar52 = vunpcklps_avx512vl(auVar57,auVar58);
            auVar57 = vunpckhps_avx512vl(auVar57,auVar58);
            auVar58 = vunpcklps_avx512vl(auVar59,auVar43);
            auVar59 = vunpckhps_avx512vl(auVar59,auVar43);
            auVar43 = *(undefined1 (*) [16])(lVar40 + uVar36 * 4);
            auVar59 = vunpcklps_avx512vl(auVar57,auVar59);
            auVar46 = vunpcklps_avx512vl(auVar52,auVar58);
            auVar58 = vunpckhps_avx512vl(auVar52,auVar58);
            auVar57 = vunpcklps_avx512vl(auVar60,auVar61);
            auVar60 = vunpckhps_avx512vl(auVar60,auVar61);
            auVar61 = vunpcklps_avx512vl(auVar62,auVar43);
            auVar62 = vunpckhps_avx512vl(auVar62,auVar43);
            auVar43 = *(undefined1 (*) [16])(lVar40 + uVar30 * 4);
            auVar60 = vunpcklps_avx512vl(auVar60,auVar62);
            auVar62 = vunpcklps_avx512vl(auVar57,auVar61);
            auVar61 = vunpckhps_avx512vl(auVar57,auVar61);
            auVar52 = vunpcklps_avx512vl(auVar63,auVar65);
            auVar57 = vunpckhps_avx512vl(auVar63,auVar65);
            auVar63 = vunpcklps_avx512vl(auVar64,auVar43);
            auVar64 = vunpckhps_avx512vl(auVar64,auVar43);
            auVar43 = *(undefined1 (*) [16])(lVar40 + uVar38 * 4);
            auVar57 = vunpcklps_avx(auVar57,auVar64);
            auVar64 = vunpcklps_avx512vl(auVar52,auVar63);
            auVar63 = vunpckhps_avx512vl(auVar52,auVar63);
            auVar65 = vunpcklps_avx512vl(auVar67,auVar66);
            auVar66 = vunpckhps_avx512vl(auVar67,auVar66);
            auVar67 = vunpcklps_avx512vl(auVar68,auVar43);
            auVar43 = vunpckhps_avx512vl(auVar68,auVar43);
            auVar66 = vunpcklps_avx(auVar66,auVar43);
            auVar68 = vunpcklps_avx512vl(auVar65,auVar67);
            auVar67 = vunpckhps_avx512vl(auVar65,auVar67);
            auVar43 = ZEXT416((uint)(fVar80 - auVar45._0_4_));
            auVar65 = vbroadcastss_avx512vl(auVar43);
            auVar43 = vsubss_avx512f(ZEXT416(0x3f800000),auVar43);
            auVar52._0_4_ = auVar43._0_4_;
            auVar52._4_4_ = auVar52._0_4_;
            auVar52._8_4_ = auVar52._0_4_;
            auVar52._12_4_ = auVar52._0_4_;
            auVar43 = vmulps_avx512vl(auVar65,auVar46);
            auVar47 = vfmadd231ps_avx512vl(auVar43,auVar52,auVar47);
            auVar43 = vmulps_avx512vl(auVar65,auVar58);
            auVar58 = vfmadd231ps_avx512vl(auVar43,auVar52,auVar48);
            auVar43 = vmulps_avx512vl(auVar65,auVar59);
            auVar43 = vfmadd231ps_fma(auVar43,auVar52,auVar2);
            auVar59 = vmulps_avx512vl(auVar65,auVar62);
            auVar59 = vfmadd231ps_avx512vl(auVar59,auVar52,auVar50);
            auVar62 = vmulps_avx512vl(auVar65,auVar61);
            auVar62 = vfmadd231ps_avx512vl(auVar62,auVar52,auVar49);
            auVar60 = vmulps_avx512vl(auVar65,auVar60);
            auVar60 = vfmadd231ps_fma(auVar60,auVar52,auVar51);
            auVar49 = vmulps_avx512vl(auVar65,auVar64);
            auVar49 = vfmadd231ps_fma(auVar49,auVar52,auVar54);
            auVar63 = vmulps_avx512vl(auVar65,auVar63);
            auVar63 = vfmadd231ps_fma(auVar63,auVar52,auVar53);
            auVar57 = vmulps_avx512vl(auVar65,auVar57);
            auVar44 = vfmadd231ps_fma(auVar57,auVar52,auVar44);
            auVar57 = vmulps_avx512vl(auVar65,auVar68);
            auVar51 = vmulps_avx512vl(auVar65,auVar67);
            auVar67 = vmulps_avx512vl(auVar65,auVar66);
            auVar66 = vfmadd231ps_fma(auVar57,auVar52,auVar56);
            lVar40 = uVar37 + 0x40 + lVar39;
            local_1380 = *(undefined8 *)(lVar40 + 0x10);
            uStack_1378 = *(undefined8 *)(lVar40 + 0x18);
            auVar57 = vfmadd231ps_fma(auVar51,auVar52,auVar55);
            uStack_1370 = local_1380;
            uStack_1368 = uStack_1378;
            lVar39 = uVar37 + 0x50 + lVar39;
            local_13a0 = *(undefined8 *)(lVar39 + 0x10);
            uStack_1398 = *(undefined8 *)(lVar39 + 0x18);
            auVar42 = vfmadd231ps_fma(auVar67,auVar52,auVar42);
            uStack_1390 = local_13a0;
            uStack_1388 = uStack_1398;
            auVar72 = vinsertf32x4_avx512vl(ZEXT1632(auVar47),auVar49,1);
            auVar73 = vinsertf32x4_avx512vl(ZEXT1632(auVar58),auVar63,1);
            auVar89._16_16_ = auVar44;
            auVar89._0_16_ = auVar43;
            auVar76._16_16_ = auVar59;
            auVar76._0_16_ = auVar59;
            auVar74 = vinsertf32x4_avx512vl(ZEXT1632(auVar62),auVar62,1);
            auVar85._16_16_ = auVar60;
            auVar85._0_16_ = auVar60;
            auVar79._16_16_ = auVar66;
            auVar79._0_16_ = auVar66;
            auVar92._16_16_ = auVar57;
            auVar92._0_16_ = auVar57;
            auVar87._16_16_ = auVar42;
            auVar87._0_16_ = auVar42;
            auVar69 = vsubps_avx(auVar72,auVar76);
            auVar70 = vsubps_avx(auVar73,auVar74);
            auVar71 = vsubps_avx(auVar89,auVar85);
            auVar75 = vsubps_avx(auVar79,auVar72);
            auVar13 = vsubps_avx(auVar92,auVar73);
            auVar14 = vsubps_avx(auVar87,auVar89);
            auVar23._4_4_ = auVar70._4_4_ * auVar14._4_4_;
            auVar23._0_4_ = auVar70._0_4_ * auVar14._0_4_;
            auVar23._8_4_ = auVar70._8_4_ * auVar14._8_4_;
            auVar23._12_4_ = auVar70._12_4_ * auVar14._12_4_;
            auVar23._16_4_ = auVar70._16_4_ * auVar14._16_4_;
            auVar23._20_4_ = auVar70._20_4_ * auVar14._20_4_;
            auVar23._24_4_ = auVar70._24_4_ * auVar14._24_4_;
            auVar23._28_4_ = auVar59._12_4_;
            auVar42 = vfmsub231ps_fma(auVar23,auVar13,auVar71);
            auVar24._4_4_ = auVar75._4_4_ * auVar71._4_4_;
            auVar24._0_4_ = auVar75._0_4_ * auVar71._0_4_;
            auVar24._8_4_ = auVar75._8_4_ * auVar71._8_4_;
            auVar24._12_4_ = auVar75._12_4_ * auVar71._12_4_;
            auVar24._16_4_ = auVar75._16_4_ * auVar71._16_4_;
            auVar24._20_4_ = auVar75._20_4_ * auVar71._20_4_;
            auVar24._24_4_ = auVar75._24_4_ * auVar71._24_4_;
            auVar24._28_4_ = auVar74._28_4_;
            fVar80 = (ray->dir).field_0.m128[0];
            auVar105._4_4_ = fVar80;
            auVar105._0_4_ = fVar80;
            auVar105._8_4_ = fVar80;
            auVar105._12_4_ = fVar80;
            auVar105._16_4_ = fVar80;
            auVar105._20_4_ = fVar80;
            auVar105._24_4_ = fVar80;
            auVar105._28_4_ = fVar80;
            fVar77 = (ray->dir).field_0.m128[1];
            auVar106._4_4_ = fVar77;
            auVar106._0_4_ = fVar77;
            auVar106._8_4_ = fVar77;
            auVar106._12_4_ = fVar77;
            auVar106._16_4_ = fVar77;
            auVar106._20_4_ = fVar77;
            auVar106._24_4_ = fVar77;
            auVar106._28_4_ = fVar77;
            fVar99 = (ray->dir).field_0.m128[2];
            auVar107._4_4_ = fVar99;
            auVar107._0_4_ = fVar99;
            auVar107._8_4_ = fVar99;
            auVar107._12_4_ = fVar99;
            auVar107._16_4_ = fVar99;
            auVar107._20_4_ = fVar99;
            auVar107._24_4_ = fVar99;
            auVar107._28_4_ = fVar99;
            uVar78 = *(undefined4 *)&(ray->org).field_0;
            auVar74._4_4_ = uVar78;
            auVar74._0_4_ = uVar78;
            auVar74._8_4_ = uVar78;
            auVar74._12_4_ = uVar78;
            auVar74._16_4_ = uVar78;
            auVar74._20_4_ = uVar78;
            auVar74._24_4_ = uVar78;
            auVar74._28_4_ = uVar78;
            auVar74 = vsubps_avx512vl(auVar72,auVar74);
            uVar78 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar72._4_4_ = uVar78;
            auVar72._0_4_ = uVar78;
            auVar72._8_4_ = uVar78;
            auVar72._12_4_ = uVar78;
            auVar72._16_4_ = uVar78;
            auVar72._20_4_ = uVar78;
            auVar72._24_4_ = uVar78;
            auVar72._28_4_ = uVar78;
            auVar72 = vsubps_avx512vl(auVar73,auVar72);
            auVar57 = vfmsub231ps_fma(auVar24,auVar14,auVar69);
            uVar78 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar19._4_4_ = uVar78;
            auVar19._0_4_ = uVar78;
            auVar19._8_4_ = uVar78;
            auVar19._12_4_ = uVar78;
            auVar19._16_4_ = uVar78;
            auVar19._20_4_ = uVar78;
            auVar19._24_4_ = uVar78;
            auVar19._28_4_ = uVar78;
            local_1300 = vsubps_avx512vl(auVar89,auVar19);
            auVar25._4_4_ = fVar80 * auVar72._4_4_;
            auVar25._0_4_ = fVar80 * auVar72._0_4_;
            auVar25._8_4_ = fVar80 * auVar72._8_4_;
            auVar25._12_4_ = fVar80 * auVar72._12_4_;
            auVar25._16_4_ = fVar80 * auVar72._16_4_;
            auVar25._20_4_ = fVar80 * auVar72._20_4_;
            auVar25._24_4_ = fVar80 * auVar72._24_4_;
            auVar25._28_4_ = auVar73._28_4_;
            auVar66 = vfmsub231ps_fma(auVar25,auVar74,auVar106);
            auVar73._4_4_ = auVar14._4_4_ * auVar66._4_4_;
            auVar73._0_4_ = auVar14._0_4_ * auVar66._0_4_;
            auVar73._8_4_ = auVar14._8_4_ * auVar66._8_4_;
            auVar73._12_4_ = auVar14._12_4_ * auVar66._12_4_;
            auVar73._16_4_ = auVar14._16_4_ * 0.0;
            auVar73._20_4_ = auVar14._20_4_ * 0.0;
            auVar73._24_4_ = auVar14._24_4_ * 0.0;
            auVar73._28_4_ = auVar44._12_4_;
            auVar26._4_4_ = auVar71._4_4_ * auVar66._4_4_;
            auVar26._0_4_ = auVar71._0_4_ * auVar66._0_4_;
            auVar26._8_4_ = auVar71._8_4_ * auVar66._8_4_;
            auVar26._12_4_ = auVar71._12_4_ * auVar66._12_4_;
            auVar26._16_4_ = auVar71._16_4_ * 0.0;
            auVar26._20_4_ = auVar71._20_4_ * 0.0;
            auVar26._24_4_ = auVar71._24_4_ * 0.0;
            auVar26._28_4_ = auVar14._28_4_;
            auVar81._0_4_ = fVar99 * auVar74._0_4_;
            auVar81._4_4_ = fVar99 * auVar74._4_4_;
            auVar81._8_4_ = fVar99 * auVar74._8_4_;
            auVar81._12_4_ = fVar99 * auVar74._12_4_;
            auVar81._16_4_ = fVar99 * auVar74._16_4_;
            auVar81._20_4_ = fVar99 * auVar74._20_4_;
            auVar81._24_4_ = fVar99 * auVar74._24_4_;
            auVar81._28_4_ = 0;
            auVar43 = vfmsub231ps_fma(auVar81,local_1300,auVar105);
            auVar66 = vfmadd231ps_fma(auVar73,ZEXT1632(auVar43),auVar13);
            auVar43 = vfmadd231ps_fma(auVar26,auVar70,ZEXT1632(auVar43));
            auVar14._4_4_ = auVar69._4_4_ * auVar13._4_4_;
            auVar14._0_4_ = auVar69._0_4_ * auVar13._0_4_;
            auVar14._8_4_ = auVar69._8_4_ * auVar13._8_4_;
            auVar14._12_4_ = auVar69._12_4_ * auVar13._12_4_;
            auVar14._16_4_ = auVar69._16_4_ * auVar13._16_4_;
            auVar14._20_4_ = auVar69._20_4_ * auVar13._20_4_;
            auVar14._24_4_ = auVar69._24_4_ * auVar13._24_4_;
            auVar14._28_4_ = auVar71._28_4_;
            auVar44 = vfmsub231ps_fma(auVar14,auVar75,auVar70);
            auVar82._0_4_ = fVar77 * local_1300._0_4_;
            auVar82._4_4_ = fVar77 * local_1300._4_4_;
            auVar82._8_4_ = fVar77 * local_1300._8_4_;
            auVar82._12_4_ = fVar77 * local_1300._12_4_;
            auVar82._16_4_ = fVar77 * local_1300._16_4_;
            auVar82._20_4_ = fVar77 * local_1300._20_4_;
            auVar82._24_4_ = fVar77 * local_1300._24_4_;
            auVar82._28_4_ = 0;
            auVar60 = vfmsub231ps_fma(auVar82,auVar72,auVar107);
            fVar80 = auVar44._0_4_;
            fVar77 = auVar44._4_4_;
            auVar27._4_4_ = fVar99 * fVar77;
            auVar27._0_4_ = fVar99 * fVar80;
            fVar83 = auVar44._8_4_;
            auVar27._8_4_ = fVar99 * fVar83;
            fVar84 = auVar44._12_4_;
            auVar27._12_4_ = fVar99 * fVar84;
            auVar27._16_4_ = fVar99 * 0.0;
            auVar27._20_4_ = fVar99 * 0.0;
            auVar27._24_4_ = fVar99 * 0.0;
            auVar27._28_4_ = auVar70._28_4_;
            auVar44 = vfmadd231ps_fma(auVar27,ZEXT1632(auVar57),auVar106);
            auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),ZEXT1632(auVar42),auVar105);
            auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),ZEXT1632(auVar60),auVar75);
            auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar69,ZEXT1632(auVar60));
            auVar70._8_4_ = 0x7fffffff;
            auVar70._0_8_ = 0x7fffffff7fffffff;
            auVar70._12_4_ = 0x7fffffff;
            auVar70._16_4_ = 0x7fffffff;
            auVar70._20_4_ = 0x7fffffff;
            auVar70._24_4_ = 0x7fffffff;
            auVar70._28_4_ = 0x7fffffff;
            vandps_avx512vl(ZEXT1632(auVar44),auVar70);
            auVar13._8_4_ = 0x80000000;
            auVar13._0_8_ = 0x8000000080000000;
            auVar13._12_4_ = 0x80000000;
            auVar13._16_4_ = 0x80000000;
            auVar13._20_4_ = 0x80000000;
            auVar13._24_4_ = 0x80000000;
            auVar13._28_4_ = 0x80000000;
            auVar69 = vandpd_avx512vl(ZEXT1632(auVar44),auVar13);
            uVar32 = auVar69._0_4_;
            auVar90._0_4_ = (float)(uVar32 ^ auVar66._0_4_);
            uVar96 = auVar69._4_4_;
            auVar90._4_4_ = (float)(uVar96 ^ auVar66._4_4_);
            uVar97 = auVar69._8_4_;
            auVar90._8_4_ = (float)(uVar97 ^ auVar66._8_4_);
            uVar98 = auVar69._12_4_;
            auVar90._12_4_ = (float)(uVar98 ^ auVar66._12_4_);
            fVar99 = auVar69._16_4_;
            auVar90._16_4_ = fVar99;
            fVar100 = auVar69._20_4_;
            auVar90._20_4_ = fVar100;
            fVar101 = auVar69._24_4_;
            auVar90._24_4_ = fVar101;
            fVar102 = auVar69._28_4_;
            auVar90._28_4_ = fVar102;
            auVar93._0_4_ = (float)(uVar32 ^ auVar43._0_4_);
            auVar93._4_4_ = (float)(uVar96 ^ auVar43._4_4_);
            auVar93._8_4_ = (float)(uVar97 ^ auVar43._8_4_);
            auVar93._12_4_ = (float)(uVar98 ^ auVar43._12_4_);
            auVar93._16_4_ = fVar99;
            auVar93._20_4_ = fVar100;
            auVar93._24_4_ = fVar101;
            auVar93._28_4_ = fVar102;
            uVar15 = vcmpps_avx512vl(auVar90,ZEXT832(0) << 0x20,5);
            uVar16 = vcmpps_avx512vl(auVar93,ZEXT832(0) << 0x20,5);
            uVar17 = vcmpps_avx512vl(ZEXT1632(auVar44),ZEXT832(0) << 0x20,4);
            auVar103._0_4_ = auVar93._0_4_ + auVar90._0_4_;
            auVar103._4_4_ = auVar93._4_4_ + auVar90._4_4_;
            auVar103._8_4_ = auVar93._8_4_ + auVar90._8_4_;
            auVar103._12_4_ = auVar93._12_4_ + auVar90._12_4_;
            auVar103._16_4_ = fVar99 + fVar99;
            auVar103._20_4_ = fVar100 + fVar100;
            auVar103._24_4_ = fVar101 + fVar101;
            auVar103._28_4_ = fVar102 + fVar102;
            uVar18 = vcmpps_avx512vl(auVar103,local_1300,2);
            local_12df = (byte)uVar15 & (byte)uVar16 & (byte)uVar17 & (byte)uVar18;
            if (local_12df != 0) {
              auVar28._4_4_ = fVar77 * local_1300._4_4_;
              auVar28._0_4_ = fVar80 * local_1300._0_4_;
              auVar28._8_4_ = fVar83 * local_1300._8_4_;
              auVar28._12_4_ = fVar84 * local_1300._12_4_;
              auVar28._16_4_ = local_1300._16_4_ * 0.0;
              auVar28._20_4_ = local_1300._20_4_ * 0.0;
              auVar28._24_4_ = local_1300._24_4_ * 0.0;
              auVar28._28_4_ = local_1300._28_4_;
              auVar66 = vfmadd213ps_fma(auVar72,ZEXT1632(auVar57),auVar28);
              auVar66 = vfmadd213ps_fma(auVar74,ZEXT1632(auVar42),ZEXT1632(auVar66));
              local_1320._0_4_ = (float)(uVar32 ^ auVar66._0_4_);
              local_1320._4_4_ = (float)(uVar96 ^ auVar66._4_4_);
              local_1320._8_4_ = (float)(uVar97 ^ auVar66._8_4_);
              local_1320._12_4_ = (float)(uVar98 ^ auVar66._12_4_);
              local_1320._16_4_ = fVar99;
              local_1320._20_4_ = fVar100;
              local_1320._24_4_ = fVar101;
              local_1320._28_4_ = fVar102;
              uVar78 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar20._4_4_ = uVar78;
              auVar20._0_4_ = uVar78;
              auVar20._8_4_ = uVar78;
              auVar20._12_4_ = uVar78;
              auVar20._16_4_ = uVar78;
              auVar20._20_4_ = uVar78;
              auVar20._24_4_ = uVar78;
              auVar20._28_4_ = uVar78;
              auVar69 = vmulps_avx512vl(local_1300,auVar20);
              uVar15 = vcmpps_avx512vl(auVar69,local_1320,1);
              fVar102 = ray->tfar;
              auVar21._4_4_ = fVar102;
              auVar21._0_4_ = fVar102;
              auVar21._8_4_ = fVar102;
              auVar21._12_4_ = fVar102;
              auVar21._16_4_ = fVar102;
              auVar21._20_4_ = fVar102;
              auVar21._24_4_ = fVar102;
              auVar21._28_4_ = fVar102;
              auVar69 = vmulps_avx512vl(local_1300,auVar21);
              uVar16 = vcmpps_avx512vl(local_1320,auVar69,2);
              local_12df = (byte)uVar15 & (byte)uVar16 & local_12df;
              if (local_12df != 0) {
                auVar69 = vsubps_avx(local_1300,auVar93);
                local_1360 = vblendps_avx(auVar90,auVar69,0xf0);
                auVar69 = vsubps_avx(local_1300,auVar90);
                local_1340 = vblendps_avx(auVar93,auVar69,0xf0);
                fVar102 = (float)DAT_01fef940;
                local_1260._0_4_ = auVar42._0_4_ * fVar102;
                fVar7 = DAT_01fef940._4_4_;
                local_1260._4_4_ = auVar42._4_4_ * fVar7;
                fVar8 = DAT_01fef940._8_4_;
                local_1260._8_4_ = auVar42._8_4_ * fVar8;
                fVar9 = DAT_01fef940._12_4_;
                local_1260._12_4_ = auVar42._12_4_ * fVar9;
                fVar10 = DAT_01fef940._16_4_;
                local_1260._16_4_ = fVar10 * 0.0;
                fVar11 = DAT_01fef940._20_4_;
                local_1260._20_4_ = fVar11 * 0.0;
                fVar12 = DAT_01fef940._24_4_;
                local_1260._24_4_ = fVar12 * 0.0;
                local_1260._28_4_ = 0;
                local_1240._4_4_ = auVar57._4_4_ * fVar7;
                local_1240._0_4_ = auVar57._0_4_ * fVar102;
                local_1240._8_4_ = auVar57._8_4_ * fVar8;
                local_1240._12_4_ = auVar57._12_4_ * fVar9;
                local_1240._16_4_ = fVar10 * 0.0;
                local_1240._20_4_ = fVar11 * 0.0;
                local_1240._24_4_ = fVar12 * 0.0;
                local_1240._28_4_ = 0;
                local_1220._4_4_ = fVar77 * fVar7;
                local_1220._0_4_ = fVar80 * fVar102;
                local_1220._8_4_ = fVar83 * fVar8;
                local_1220._12_4_ = fVar84 * fVar9;
                local_1220._16_4_ = fVar10 * 0.0;
                local_1220._20_4_ = fVar11 * 0.0;
                local_1220._24_4_ = fVar12 * 0.0;
                local_1220._28_4_ = 0;
                auVar69 = vrcp14ps_avx512vl(local_1300);
                auVar22._8_4_ = 0x3f800000;
                auVar22._0_8_ = 0x3f8000003f800000;
                auVar22._12_4_ = 0x3f800000;
                auVar22._16_4_ = 0x3f800000;
                auVar22._20_4_ = 0x3f800000;
                auVar22._24_4_ = 0x3f800000;
                auVar22._28_4_ = 0x3f800000;
                auVar70 = vfnmadd213ps_avx512vl(local_1300,auVar69,auVar22);
                auVar66 = vfmadd132ps_fma(auVar70,auVar69,auVar69);
                fVar80 = auVar66._0_4_;
                fVar77 = auVar66._4_4_;
                fVar83 = auVar66._8_4_;
                fVar84 = auVar66._12_4_;
                uStack_1264 = auVar69._28_4_;
                local_1280[0] = fVar80 * local_1320._0_4_;
                local_1280[1] = fVar77 * local_1320._4_4_;
                local_1280[2] = fVar83 * local_1320._8_4_;
                local_1280[3] = fVar84 * local_1320._12_4_;
                fStack_1270 = fVar99 * 0.0;
                fStack_126c = fVar100 * 0.0;
                fStack_1268 = fVar101 * 0.0;
                local_12c0[0] = local_1360._0_4_ * fVar80;
                local_12c0[1] = local_1360._4_4_ * fVar77;
                local_12c0[2] = local_1360._8_4_ * fVar83;
                local_12c0[3] = local_1360._12_4_ * fVar84;
                fStack_12b0 = local_1360._16_4_ * 0.0;
                fStack_12ac = local_1360._20_4_ * 0.0;
                fStack_12a8 = local_1360._24_4_ * 0.0;
                uStack_12a4 = uStack_1264;
                local_12a0._4_4_ = local_1340._4_4_ * fVar77;
                local_12a0._0_4_ = local_1340._0_4_ * fVar80;
                local_12a0._8_4_ = local_1340._8_4_ * fVar83;
                local_12a0._12_4_ = local_1340._12_4_ * fVar84;
                local_12a0._16_4_ = local_1340._16_4_ * 0.0;
                local_12a0._20_4_ = local_1340._20_4_ * 0.0;
                local_12a0._24_4_ = local_1340._24_4_ * 0.0;
                local_12a0._28_4_ = uStack_1264;
                uVar30 = (ulong)local_12df;
                do {
                  auVar66 = auVar108._0_16_;
                  local_1528 = 0;
                  for (uVar33 = uVar30; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000
                      ) {
                    local_1528 = local_1528 + 1;
                  }
                  local_14e8 = *(uint *)((long)&local_1380 + local_1528 * 4);
                  local_1530 = (local_1540->geometries).items[local_14e8].ptr;
                  if ((local_1530->mask & ray->mask) != 0) {
                    pRVar6 = context->args;
                    if ((pRVar6->filter == (RTCFilterFunctionN)0x0) &&
                       (local_1530->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_006985c4:
                      ray->tfar = -INFINITY;
                      return;
                    }
                    local_1480 = auVar110._0_32_;
                    local_14a0 = auVar109._0_32_;
                    uVar33 = (ulong)(uint)((int)local_1528 * 4);
                    local_14d0.context = context->user;
                    local_1500 = *(undefined4 *)(local_1260 + uVar33);
                    local_14fc = *(undefined4 *)(local_1240 + uVar33);
                    local_14f8 = *(undefined4 *)(local_1220 + uVar33);
                    local_14f4 = *(undefined4 *)((long)local_12c0 + uVar33);
                    local_14f0 = *(undefined4 *)(local_12a0 + uVar33);
                    local_14ec = *(undefined4 *)((long)&local_13a0 + uVar33);
                    local_14e4 = (local_14d0.context)->instID[0];
                    local_14e0 = (local_14d0.context)->instPrimID[0];
                    fVar80 = ray->tfar;
                    ray->tfar = *(float *)((long)local_1280 + uVar33);
                    local_1544 = -1;
                    local_14d0.valid = &local_1544;
                    local_14d0.geometryUserPtr = local_1530->userPtr;
                    local_14d0.hit = (RTCHitN *)&local_1500;
                    local_14d0.N = 1;
                    local_14d0.ray = (RTCRayN *)ray;
                    if (((local_1530->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*local_1530->occlusionFilterN)(&local_14d0), *local_14d0.valid != 0)) &&
                       ((pRVar6->filter == (RTCFilterFunctionN)0x0 ||
                        ((((pRVar6->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((local_1530->field_8).field_0x2 & 0x40) == 0)) ||
                         ((*pRVar6->filter)(&local_14d0), *local_14d0.valid != 0))))))
                    goto LAB_006985c4;
                    ray->tfar = fVar80;
                    auVar66 = vxorps_avx512vl(auVar66,auVar66);
                    auVar108 = ZEXT1664(auVar66);
                    auVar109 = ZEXT3264(local_14a0);
                    auVar110 = ZEXT3264(local_1480);
                  }
                  uVar30 = uVar30 ^ 1L << (local_1528 & 0x3f);
                } while (uVar30 != 0);
              }
            }
            local_1538 = local_1538 + 1;
          } while (local_1538 != local_1508);
        }
        auVar94 = ZEXT3264(local_13c0);
        auVar86 = ZEXT3264(local_13e0);
        auVar95 = ZEXT3264(local_1400);
        auVar88 = ZEXT3264(local_1420);
        auVar91 = ZEXT3264(local_1440);
        auVar104 = ZEXT3264(local_1460);
        lVar40 = local_1518;
        lVar39 = local_1520;
      } while (local_1510 != &local_1200);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }